

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::ResizeTest_TestExternalResizeWorks4Threads_Test::
~ResizeTest_TestExternalResizeWorks4Threads_Test
          (ResizeTest_TestExternalResizeWorks4Threads_Test *this)

{
  anon_unknown.dwarf_19cdc37::ResizeTest::~ResizeTest((ResizeTest *)(this + -0x18));
  operator_delete((ResizeTest *)(this + -0x18));
  return;
}

Assistant:

TEST_P(ResizeTest, TestExternalResizeWorks4Threads) {
  ResizingVideoSource video(640, 480);
  video.flag_codec_ = 0;
  video.random_input_one_half_only_ = true;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_forced_max_frame_width = 640;
  cfg_.g_forced_max_frame_height = 480;
  cfg_.g_threads = 4;
  cfg_.kf_max_dist = 40;
  cfg_.kf_min_dist = 40;
  cfg_.rc_dropframe_thresh = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());

  for (const auto &info : frame_info_list_) {
    const unsigned int frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w;
    unsigned int expected_h;
    ScaleForFrameNumber(frame, 640, 480, video.flag_codec_, false,
                        video.random_input_one_half_only_, &expected_w,
                        &expected_h);
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
  }
#endif
}